

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCompoundCollisionAlgorithm.cpp
# Opt level: O3

cbtScalar __thiscall
cbtCompoundCollisionAlgorithm::calculateTimeOfImpact
          (cbtCompoundCollisionAlgorithm *this,cbtCollisionObject *body0,cbtCollisionObject *body1,
          cbtDispatcherInfo *dispatchInfo,cbtManifoldResult *resultOut)

{
  float fVar1;
  cbtScalar cVar2;
  float fVar3;
  float fVar4;
  cbtScalar cVar5;
  cbtScalar cVar6;
  cbtScalar cVar7;
  cbtScalar cVar8;
  cbtScalar cVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  uint uVar13;
  uint uVar14;
  undefined4 uVar15;
  undefined8 uVar16;
  undefined1 auVar17 [16];
  cbtTransform cVar18;
  cbtCollisionShape *pcVar19;
  void *pvVar20;
  cbtCollisionAlgorithm *pcVar21;
  float fVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined8 uVar27;
  undefined8 uVar28;
  int iVar29;
  cbtCollisionObject *pcVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  bool bVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  cbtScalar cVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  uint local_a8;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  
  bVar34 = this->m_isSwapped != false;
  pcVar30 = body1;
  if (bVar34) {
    pcVar30 = body0;
  }
  lVar32 = (long)(this->m_childCollisionAlgorithms).m_size;
  if (bVar34) {
    body0 = body1;
  }
  if (lVar32 < 1) {
    cVar38 = 1.0;
  }
  else {
    fVar1 = (body0->m_worldTransform).m_basis.m_el[2].m_floats[1];
    cVar2 = (body0->m_worldTransform).m_basis.m_el[2].m_floats[2];
    fVar3 = (body0->m_worldTransform).m_basis.m_el[0].m_floats[1];
    auVar35._4_4_ = fVar3;
    auVar35._0_4_ = fVar3;
    auVar35._8_4_ = fVar3;
    auVar35._12_4_ = fVar3;
    fVar4 = (body0->m_worldTransform).m_basis.m_el[1].m_floats[1];
    auVar41._4_4_ = fVar4;
    auVar41._0_4_ = fVar4;
    auVar41._8_4_ = fVar4;
    auVar41._12_4_ = fVar4;
    cVar38 = (body0->m_worldTransform).m_basis.m_el[0].m_floats[2];
    auVar39._4_4_ = cVar38;
    auVar39._0_4_ = cVar38;
    auVar39._8_4_ = cVar38;
    auVar39._12_4_ = cVar38;
    cVar38 = (body0->m_worldTransform).m_basis.m_el[1].m_floats[2];
    auVar43._4_4_ = cVar38;
    auVar43._0_4_ = cVar38;
    auVar43._8_4_ = cVar38;
    auVar43._12_4_ = cVar38;
    pcVar19 = body0->m_collisionShape;
    cVar18 = body0->m_worldTransform;
    auVar17 = *(undefined1 (*) [16])(body0->m_worldTransform).m_basis.m_el[1].m_floats;
    cVar5 = (body0->m_worldTransform).m_basis.m_el[2].m_floats[0];
    lVar33 = 0x38;
    lVar31 = 0;
    iVar29 = body0->m_updateRevision;
    cVar6 = (body0->m_worldTransform).m_basis.m_el[0].m_floats[0];
    cVar7 = (body0->m_worldTransform).m_basis.m_el[1].m_floats[0];
    auVar35 = vunpcklps_avx(auVar35,auVar41);
    auVar41 = vunpcklps_avx(auVar39,auVar43);
    cVar38 = 1.0;
    auVar23 = vunpcklps_avx((undefined1  [16])cVar18.m_basis.m_el[0].m_floats,auVar17);
    cVar8 = (body0->m_worldTransform).m_basis.m_el[2].m_floats[2];
    cVar9 = (body0->m_worldTransform).m_basis.m_el[2].m_floats[0];
    fVar10 = (body0->m_worldTransform).m_origin.m_floats[2];
    fVar11 = (body0->m_worldTransform).m_basis.m_el[2].m_floats[1];
    uVar27 = *(undefined8 *)(body0->m_worldTransform).m_origin.m_floats;
    uVar28 = *(undefined8 *)((body0->m_worldTransform).m_origin.m_floats + 2);
    do {
      pvVar20 = pcVar19[1].m_userPointer;
      fVar12 = *(float *)((long)pvVar20 + lVar33 + -0x20);
      uVar13 = *(uint *)((long)pvVar20 + lVar33 + -0x30);
      uVar14 = *(uint *)((long)pvVar20 + lVar33 + -0x10);
      uVar15 = *(undefined4 *)((long)pvVar20 + lVar33);
      auVar44._4_4_ = uVar15;
      auVar44._0_4_ = uVar15;
      auVar44._8_4_ = uVar15;
      auVar44._12_4_ = uVar15;
      local_78._0_4_ = cVar18.m_basis.m_el[0].m_floats[0];
      auVar36 = vfmadd231ss_fma(ZEXT416((uint)(fVar3 * fVar12)),ZEXT416(uVar13),
                                ZEXT416((uint)(cbtScalar)local_78));
      local_a8 = auVar17._0_4_;
      auVar24 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * fVar12)),ZEXT416(uVar13),ZEXT416(local_a8));
      auVar48 = ZEXT416((uint)cVar5);
      auVar25 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * fVar12)),auVar48,ZEXT416(uVar13));
      fVar12 = *(float *)((long)pvVar20 + lVar33 + -4);
      auVar50 = ZEXT416((uint)cVar2);
      auVar25 = vfmadd231ss_fma(auVar25,auVar50,ZEXT416(uVar14));
      auVar26 = vfmadd231ss_fma(auVar36,ZEXT416(uVar14),auVar39);
      auVar42 = vfmadd231ss_fma(auVar24,ZEXT416(uVar14),auVar43);
      uVar15 = *(undefined4 *)((long)pvVar20 + lVar33 + -8);
      auVar40._4_4_ = uVar15;
      auVar40._0_4_ = uVar15;
      auVar40._8_4_ = uVar15;
      auVar40._12_4_ = uVar15;
      body0->m_updateRevision = iVar29 + 1;
      local_158 = auVar35._0_4_;
      fStack_154 = auVar35._4_4_;
      fStack_150 = auVar35._8_4_;
      fStack_14c = auVar35._12_4_;
      auVar36._0_4_ = fVar12 * local_158;
      auVar36._4_4_ = fVar12 * fStack_154;
      auVar36._8_4_ = fVar12 * fStack_150;
      auVar36._12_4_ = fVar12 * fStack_14c;
      auVar36 = vfmadd231ps_fma(auVar36,auVar40,auVar23);
      auVar36 = vfmadd231ps_fma(auVar36,auVar44,auVar41);
      auVar24 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * fVar12)),auVar40,auVar48);
      auVar49._8_8_ = 0;
      auVar49._0_8_ = *(ulong *)((long)pvVar20 + lVar33 + -0x38);
      local_128 = (float)uVar27;
      fStack_124 = (float)((ulong)uVar27 >> 0x20);
      fStack_120 = (float)uVar28;
      fStack_11c = (float)((ulong)uVar28 >> 0x20);
      auVar37._0_4_ = auVar36._0_4_ + local_128;
      auVar37._4_4_ = auVar36._4_4_ + fStack_124;
      auVar37._8_4_ = auVar36._8_4_ + fStack_120;
      auVar37._12_4_ = auVar36._12_4_ + fStack_11c;
      auVar36 = vfmadd231ss_fma(auVar24,auVar44,auVar50);
      uVar16 = *(undefined8 *)((long)pvVar20 + lVar33 + -0x28);
      auVar45._8_8_ = 0;
      auVar45._0_8_ = *(ulong *)((long)pvVar20 + lVar33 + -0x18);
      fVar12 = (float)uVar16;
      auVar46._0_4_ = fVar3 * fVar12;
      fVar22 = (float)((ulong)uVar16 >> 0x20);
      auVar46._4_4_ = fVar3 * fVar22;
      auVar46._8_4_ = fVar3 * 0.0;
      auVar46._12_4_ = fVar3 * 0.0;
      auVar50._4_4_ = cVar6;
      auVar50._0_4_ = cVar6;
      auVar50._8_4_ = cVar6;
      auVar50._12_4_ = cVar6;
      auVar24 = vfmadd231ps_fma(auVar46,auVar49,auVar50);
      auVar36 = vinsertps_avx(auVar37,ZEXT416((uint)(auVar36._0_4_ + fVar10)),0x28);
      auVar24 = vfmadd231ps_fma(auVar24,auVar45,auVar39);
      uVar16 = vmovlps_avx(auVar24);
      *(undefined8 *)(body0->m_worldTransform).m_basis.m_el[0].m_floats = uVar16;
      auVar47._0_4_ = fVar4 * fVar12;
      auVar47._4_4_ = fVar4 * fVar22;
      auVar47._8_4_ = fVar4 * 0.0;
      auVar47._12_4_ = fVar4 * 0.0;
      auVar48._4_4_ = cVar7;
      auVar48._0_4_ = cVar7;
      auVar48._8_4_ = cVar7;
      auVar48._12_4_ = cVar7;
      auVar24 = vfmadd231ps_fma(auVar47,auVar49,auVar48);
      (body0->m_worldTransform).m_basis.m_el[0].m_floats[2] = auVar26._0_4_;
      (body0->m_worldTransform).m_basis.m_el[0].m_floats[3] = 0.0;
      auVar24 = vfmadd231ps_fma(auVar24,auVar45,auVar43);
      uVar16 = vmovlps_avx(auVar24);
      *(undefined8 *)(body0->m_worldTransform).m_basis.m_el[1].m_floats = uVar16;
      (body0->m_worldTransform).m_basis.m_el[1].m_floats[2] = auVar42._0_4_;
      auVar42._0_4_ = fVar12 * fVar11;
      auVar42._4_4_ = fVar22 * fVar11;
      auVar42._8_4_ = fVar11 * 0.0;
      auVar42._12_4_ = fVar11 * 0.0;
      (body0->m_worldTransform).m_basis.m_el[1].m_floats[3] = 0.0;
      auVar24._4_4_ = cVar9;
      auVar24._0_4_ = cVar9;
      auVar24._8_4_ = cVar9;
      auVar24._12_4_ = cVar9;
      auVar24 = vfmadd231ps_fma(auVar42,auVar49,auVar24);
      auVar26._4_4_ = cVar8;
      auVar26._0_4_ = cVar8;
      auVar26._8_4_ = cVar8;
      auVar26._12_4_ = cVar8;
      auVar24 = vfmadd231ps_fma(auVar24,auVar45,auVar26);
      uVar16 = vmovlps_avx(auVar24);
      *(undefined8 *)(body0->m_worldTransform).m_basis.m_el[2].m_floats = uVar16;
      (body0->m_worldTransform).m_basis.m_el[2].m_floats[2] = auVar25._0_4_;
      (body0->m_worldTransform).m_basis.m_el[2].m_floats[3] = 0.0;
      *(undefined1 (*) [16])(body0->m_worldTransform).m_origin.m_floats = auVar36;
      pcVar21 = (this->m_childCollisionAlgorithms).m_data[lVar31];
      (*pcVar21->_vptr_cbtCollisionAlgorithm[3])(pcVar21,body0,pcVar30,dispatchInfo,resultOut);
      lVar31 = lVar31 + 1;
      lVar33 = lVar33 + 0x58;
      iVar29 = body0->m_updateRevision + 1;
      body0->m_updateRevision = iVar29;
      auVar36 = vminss_avx(auVar36,ZEXT416((uint)cVar38));
      cVar38 = auVar36._0_4_;
      local_78 = cVar18.m_basis.m_el[0].m_floats._0_8_;
      uStack_70 = cVar18.m_basis.m_el[0].m_floats._8_8_;
      uStack_68 = cVar18.m_basis.m_el[1].m_floats._0_8_;
      uStack_60 = cVar18.m_basis.m_el[1].m_floats._8_8_;
      uStack_58 = cVar18.m_basis.m_el[2].m_floats._0_8_;
      uStack_50 = cVar18.m_basis.m_el[2].m_floats._8_8_;
      uStack_48 = cVar18.m_origin.m_floats._0_8_;
      uStack_40 = cVar18.m_origin.m_floats._8_8_;
      *(undefined8 *)(body0->m_worldTransform).m_basis.m_el[0].m_floats = local_78;
      *(undefined8 *)((body0->m_worldTransform).m_basis.m_el[0].m_floats + 2) = uStack_70;
      *(undefined8 *)(body0->m_worldTransform).m_basis.m_el[1].m_floats = uStack_68;
      *(undefined8 *)((body0->m_worldTransform).m_basis.m_el[1].m_floats + 2) = uStack_60;
      *(undefined8 *)(body0->m_worldTransform).m_basis.m_el[2].m_floats = uStack_58;
      *(undefined8 *)((body0->m_worldTransform).m_basis.m_el[2].m_floats + 2) = uStack_50;
      *(undefined8 *)(body0->m_worldTransform).m_origin.m_floats = uStack_48;
      *(undefined8 *)((body0->m_worldTransform).m_origin.m_floats + 2) = uStack_40;
    } while (lVar32 != lVar31);
  }
  return cVar38;
}

Assistant:

cbtScalar cbtCompoundCollisionAlgorithm::calculateTimeOfImpact(cbtCollisionObject* body0, cbtCollisionObject* body1, const cbtDispatcherInfo& dispatchInfo, cbtManifoldResult* resultOut)
{
	cbtAssert(0);
	//needs to be fixed, using cbtCollisionObjectWrapper and NOT modifying internal data structures
	cbtCollisionObject* colObj = m_isSwapped ? body1 : body0;
	cbtCollisionObject* otherObj = m_isSwapped ? body0 : body1;

	cbtAssert(colObj->getCollisionShape()->isCompound());

	cbtCompoundShape* compoundShape = static_cast<cbtCompoundShape*>(colObj->getCollisionShape());

	//We will use the OptimizedBVH, AABB tree to cull potential child-overlaps
	//If both proxies are Compound, we will deal with that directly, by performing sequential/parallel tree traversals
	//given Proxy0 and Proxy1, if both have a tree, Tree0 and Tree1, this means:
	//determine overlapping nodes of Proxy1 using Proxy0 AABB against Tree1
	//then use each overlapping node AABB against Tree0
	//and vise versa.

	cbtScalar hitFraction = cbtScalar(1.);

	int numChildren = m_childCollisionAlgorithms.size();
	int i;
	cbtTransform orgTrans;
	cbtScalar frac;
	for (i = 0; i < numChildren; i++)
	{
		//cbtCollisionShape* childShape = compoundShape->getChildShape(i);

		//backup
		orgTrans = colObj->getWorldTransform();

		const cbtTransform& childTrans = compoundShape->getChildTransform(i);
		//cbtTransform	newChildWorldTrans = orgTrans*childTrans ;
		colObj->setWorldTransform(orgTrans * childTrans);

		//cbtCollisionShape* tmpShape = colObj->getCollisionShape();
		//colObj->internalSetTemporaryCollisionShape( childShape );
		frac = m_childCollisionAlgorithms[i]->calculateTimeOfImpact(colObj, otherObj, dispatchInfo, resultOut);
		if (frac < hitFraction)
		{
			hitFraction = frac;
		}
		//revert back
		//colObj->internalSetTemporaryCollisionShape( tmpShape);
		colObj->setWorldTransform(orgTrans);
	}
	return hitFraction;
}